

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_crc.cc
# Opt level: O2

CordRepCrc * absl::lts_20250127::cord_internal::CordRepCrc::New(CordRep *child,CrcCordState *state)

{
  int iVar1;
  CordRepCrc *pCVar2;
  size_t sVar3;
  CordRep *rep;
  
  if (child == (CordRep *)0x0) {
    rep = (CordRep *)0x0;
  }
  else {
    rep = child;
    if (child->tag == '\x02') {
      iVar1 = (child->refcount).count_.super___atomic_base<int>._M_i;
      pCVar2 = CordRep::crc(child);
      if (iVar1 == 2) {
        crc_internal::CrcCordState::operator=(&pCVar2->crc_cord_state,state);
        pCVar2 = CordRep::crc(child);
        return pCVar2;
      }
      rep = pCVar2->child;
      CordRep::Ref(rep);
      CordRep::Unref(child);
    }
  }
  pCVar2 = (CordRepCrc *)operator_new(0x20);
  CordRepCrc(pCVar2);
  if (rep == (CordRep *)0x0) {
    sVar3 = 0;
  }
  else {
    sVar3 = rep->length;
  }
  (pCVar2->super_CordRep).length = sVar3;
  (pCVar2->super_CordRep).tag = '\x02';
  pCVar2->child = rep;
  crc_internal::CrcCordState::operator=(&pCVar2->crc_cord_state,state);
  return pCVar2;
}

Assistant:

CordRepCrc* CordRepCrc::New(CordRep* child, crc_internal::CrcCordState state) {
  if (child != nullptr && child->IsCrc()) {
    if (child->refcount.IsOne()) {
      child->crc()->crc_cord_state = std::move(state);
      return child->crc();
    }
    CordRep* old = child;
    child = old->crc()->child;
    CordRep::Ref(child);
    CordRep::Unref(old);
  }
  auto* new_cordrep = new CordRepCrc;
  new_cordrep->length = child != nullptr ? child->length : 0;
  new_cordrep->tag = cord_internal::CRC;
  new_cordrep->child = child;
  new_cordrep->crc_cord_state = std::move(state);
  return new_cordrep;
}